

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_h_predictor_4x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined2 uVar2;
  undefined1 auVar1 [12];
  undefined1 auVar3 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar14 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar7 = *(undefined1 (*) [16])left;
  auVar13._0_14_ = auVar7._0_14_;
  auVar13[0xe] = auVar7[7];
  auVar13[0xf] = auVar7[7];
  auVar6._14_2_ = auVar13._14_2_;
  auVar6._0_13_ = auVar7._0_13_;
  auVar6[0xd] = auVar7[6];
  auVar5._13_3_ = auVar6._13_3_;
  auVar5._0_12_ = auVar7._0_12_;
  auVar5[0xc] = auVar7[6];
  auVar4._12_4_ = auVar5._12_4_;
  auVar4._0_11_ = auVar7._0_11_;
  auVar4[0xb] = auVar7[5];
  auVar3._11_5_ = auVar4._11_5_;
  auVar3._0_10_ = auVar7._0_10_;
  auVar3[10] = auVar7[5];
  auVar11._10_6_ = auVar3._10_6_;
  auVar11._0_9_ = auVar7._0_9_;
  auVar11[9] = auVar7[4];
  auVar12._9_7_ = auVar11._9_7_;
  auVar12._0_8_ = auVar7._0_8_;
  auVar12[8] = auVar7[4];
  auVar9._8_8_ = auVar12._8_8_;
  auVar9[7] = auVar7[3];
  auVar9[6] = auVar7[3];
  auVar9[5] = auVar7[2];
  auVar9[4] = auVar7[2];
  auVar9[3] = auVar7[1];
  auVar9[2] = auVar7[1];
  auVar9[1] = auVar7[0];
  auVar9[0] = auVar7[0];
  auVar1._0_10_ =
       CONCAT19(auVar7[0xc],
                CONCAT18(auVar7[0xc],
                         CONCAT17(auVar7[0xb],
                                  CONCAT16(auVar7[0xb],
                                           CONCAT15(auVar7[10],
                                                    CONCAT14(auVar7[10],
                                                             CONCAT13(auVar7[9],
                                                                      CONCAT12(auVar7[9],
                                                                               CONCAT11(auVar7[8],
                                                                                        auVar7[8])))
                                                            ))))));
  auVar1[10] = auVar7[0xd];
  auVar1[0xb] = auVar7[0xd];
  auVar10[0xc] = auVar7[0xe];
  auVar10._0_12_ = auVar1;
  auVar10[0xd] = auVar7[0xe];
  auVar10[0xf] = auVar7[0xf];
  auVar10[0xe] = auVar10[0xf];
  auVar7 = pshuflw(in_XMM2,auVar9,0);
  auVar11 = pshuflw(in_XMM3,auVar9,0x55);
  auVar13 = pshuflw(in_XMM4,auVar9,0xaa);
  auVar14 = pshuflw(in_XMM5,auVar9,0xff);
  *(int *)dst = auVar7._0_4_;
  *(int *)(dst + stride) = auVar11._0_4_;
  *(int *)(dst + stride * 2) = auVar13._0_4_;
  *(int *)(dst + stride * 3) = auVar14._0_4_;
  auVar8._8_4_ = auVar12._8_4_;
  auVar8._0_8_ = auVar9._8_8_;
  auVar8._12_4_ = auVar4._12_4_;
  auVar7._0_4_ = CONCAT22(auVar12._8_2_,auVar12._8_2_);
  auVar7._4_2_ = auVar3._10_2_;
  auVar7._6_2_ = auVar3._10_2_;
  auVar7._8_2_ = auVar5._12_2_;
  auVar7._10_2_ = auVar5._12_2_;
  auVar7._12_2_ = auVar6._14_2_;
  auVar7._14_2_ = auVar6._14_2_;
  auVar12 = pshuflw(auVar11,auVar8,0x55);
  auVar11 = pshuflw(auVar13,auVar8,0xaa);
  auVar9 = pshuflw(auVar8,auVar8,0xff);
  *(undefined4 *)(dst + stride * 4) = auVar7._0_4_;
  *(int *)(dst + stride * 5) = auVar12._0_4_;
  *(int *)(dst + stride * 6) = auVar11._0_4_;
  *(int *)(dst + stride * 7) = auVar9._0_4_;
  auVar7 = pshuflw(auVar7,auVar10,0);
  auVar9 = pshuflw(auVar9,auVar10,0x55);
  auVar12 = pshuflw(auVar12,auVar10,0xaa);
  auVar11 = pshuflw(auVar11,auVar10,0xff);
  *(int *)(dst + stride * 8) = auVar7._0_4_;
  *(int *)(dst + stride * 9) = auVar9._0_4_;
  *(int *)(dst + stride * 10) = auVar12._0_4_;
  *(int *)(dst + stride * 0xb) = auVar11._0_4_;
  auVar14._4_4_ = auVar10._12_4_;
  auVar14._0_4_ = auVar1._8_4_;
  auVar14._8_4_ = auVar1._8_4_;
  auVar14._12_4_ = auVar10._12_4_;
  uVar2 = (undefined2)((unkuint10)auVar1._0_10_ >> 0x40);
  auVar10 = pshuflw(auVar9,auVar14,0x55);
  auVar9 = pshuflw(auVar12,auVar14,0xaa);
  auVar7 = pshuflw(auVar14,auVar14,0xff);
  *(uint *)(dst + stride * 0xc) = CONCAT22(uVar2,uVar2);
  *(int *)(dst + stride * 0xd) = auVar10._0_4_;
  *(int *)(dst + stride * 0xe) = auVar9._0_4_;
  *(int *)(dst + stride * 0xf) = auVar7._0_4_;
  return;
}

Assistant:

void aom_h_predictor_4x16_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  (void)above;
  const __m128i left_col = _mm_load_si128((__m128i const *)left);
  __m128i left_col_low = _mm_unpacklo_epi8(left_col, left_col);
  __m128i left_col_high = _mm_unpackhi_epi8(left_col, left_col);

  __m128i row0 = _mm_shufflelo_epi16(left_col_low, 0);
  __m128i row1 = _mm_shufflelo_epi16(left_col_low, 0x55);
  __m128i row2 = _mm_shufflelo_epi16(left_col_low, 0xaa);
  __m128i row3 = _mm_shufflelo_epi16(left_col_low, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
  dst += stride;

  left_col_low = _mm_unpackhi_epi64(left_col_low, left_col_low);
  row0 = _mm_shufflelo_epi16(left_col_low, 0);
  row1 = _mm_shufflelo_epi16(left_col_low, 0x55);
  row2 = _mm_shufflelo_epi16(left_col_low, 0xaa);
  row3 = _mm_shufflelo_epi16(left_col_low, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
  dst += stride;

  row0 = _mm_shufflelo_epi16(left_col_high, 0);
  row1 = _mm_shufflelo_epi16(left_col_high, 0x55);
  row2 = _mm_shufflelo_epi16(left_col_high, 0xaa);
  row3 = _mm_shufflelo_epi16(left_col_high, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
  dst += stride;

  left_col_high = _mm_unpackhi_epi64(left_col_high, left_col_high);
  row0 = _mm_shufflelo_epi16(left_col_high, 0);
  row1 = _mm_shufflelo_epi16(left_col_high, 0x55);
  row2 = _mm_shufflelo_epi16(left_col_high, 0xaa);
  row3 = _mm_shufflelo_epi16(left_col_high, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
}